

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exorList.c
# Opt level: O3

int CheckForCloseCubes(Cube *p,int fAddCube)

{
  drow *pdVar1;
  drow *pdVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  short sVar6;
  cubedist Dist;
  Cube *pCVar7;
  uint uVar8;
  
  s_Que[0].PosCur = s_Que[0].PosIn;
  s_Que[1].PosCur = s_Que[1].PosIn;
  s_Que[2].PosCur = s_Que[2].PosIn;
  s_q = s_List;
  iVar5 = 0;
  if (s_List == (Cube *)0x0) {
LAB_0034db9e:
    if (fAddCube != 0) {
LAB_0034dba2:
      CubeInsert(p);
    }
    iVar3 = 0;
LAB_0034dbd0:
    s_Que[0].PosIn = s_Que[0].PosCur;
    s_Que[1].PosIn = s_Que[1].PosCur;
    s_Que[2].PosIn = s_Que[2].PosCur;
    return iVar5 + iVar3;
  }
LAB_0034d9c3:
  do {
    s_Distance = GetDistancePlus(p,s_q);
    if (s_Distance < 5) {
      switch(s_Distance) {
      case 1:
        goto switchD_0034d9e8_caseD_1;
      case 2:
        Dist = DIST2;
        if (s_fDistEnable2 == 0) goto LAB_0034da14;
        goto LAB_0034da05;
      case 3:
        Dist = DIST3;
        iVar3 = s_fDistEnable3;
        break;
      case 4:
        Dist = DIST4;
        iVar3 = s_fDistEnable4;
        break;
      default:
        AddToFreeCubes(p);
        pCVar7 = s_q;
        CubeExtract(s_q);
        AddToFreeCubes(pCVar7);
        s_Que[0].PosCur = s_Que[0].PosIn;
        s_Que[1].PosCur = s_Que[1].PosIn;
        s_Que[2].PosCur = s_Que[2].PosIn;
        iVar3 = 2;
        goto LAB_0034dbd0;
      }
      if (iVar3 != 0) {
LAB_0034da05:
        NewRangeInsertCubePair(Dist,p,s_q);
      }
    }
LAB_0034da14:
    s_q = s_q->Next;
  } while (s_q != (Cube *)0x0);
  goto LAB_0034db9e;
switchD_0034d9e8_caseD_1:
  s_ChangeStore_0 = (uint)(s_DiffVarNum != -1);
  s_ChangeStore_2 = (int)s_q->a;
  _s_ChangeStore_3 = (int)p->a;
  s_ChangeStore_4 = (int)s_q->q;
  _s_ChangeStore_5 = (int)p->q;
  _s_ChangeStore_6 = (int)p->z;
  s_ChangeStore_7 = s_DiffVarNum;
  s_ChangeStore_8 = s_DiffVarValueQ;
  _s_ChangeStore_9 = (uint)s_q->ID;
  s_ChangeStore_1 = p;
  CubeExtract(s_q);
  if (s_DiffVarNum == -1) {
    p->z = 0;
    pCVar7 = s_q;
    if (0 < g_CoverInfo.nWordsOut) {
      pdVar1 = s_q->pCubeDataOut;
      pdVar2 = p->pCubeDataOut;
      lVar4 = 0;
      sVar6 = 0;
      do {
        uVar8 = pdVar2[lVar4] ^ pdVar1[lVar4];
        pdVar2[lVar4] = uVar8;
        sVar6 = sVar6 + (ushort)BitCount[uVar8 >> 0x10] + (ushort)BitCount[uVar8 & 0xffff];
        p->z = sVar6;
        lVar4 = lVar4 + 1;
      } while (lVar4 < g_CoverInfo.nWordsOut);
    }
  }
  else {
    if (s_DiffVarValueP_old - 1U < 2) {
      p->a = p->a + -1;
    }
    if (s_DiffVarValueP_new - 1U < 2) {
      p->a = p->a + 1;
    }
    iVar3 = ComputeQCostBits(p);
    p->q = (short)iVar3;
    pCVar7 = s_q;
  }
  AddToFreeCubes(pCVar7);
  iVar5 = iVar5 + 1;
  s_Que[0].PosCur = s_Que[0].PosIn;
  s_Que[1].PosCur = s_Que[1].PosIn;
  s_Que[2].PosCur = s_Que[2].PosIn;
  s_q = s_List;
  fAddCube = 1;
  if (s_List == (Cube *)0x0) goto LAB_0034dba2;
  goto LAB_0034d9c3;
}

Assistant:

int CheckForCloseCubes( Cube* p, int fAddCube )
// checks the cube storage for a cube that is dist-0 and dist-1 removed 
// from the given one (p) if such a cube is found, extracts it from the data 
// structure, EXORs it with the given cube, adds the resultant cube
// to the data structure and performed the same check for the resultant cube;
// returns the number of cubes gained in the process of reduction;
// if an adjacent cube is not found, inserts the cube only if (fAddCube==1)!!!
{
    // start the new range
    NewRangeReset();

    for ( s_q = s_List; s_q; s_q = s_q->Next )
    {
        s_Distance = GetDistancePlus( p, s_q );
        if ( s_Distance > 4 )
        {
        }
        else if ( s_Distance == 4 )
        {
            if ( s_fDistEnable4 ) 
                NewRangeInsertCubePair( DIST4, p, s_q );
        }
        else if ( s_Distance == 3 )
        {
            if ( s_fDistEnable3 ) 
                NewRangeInsertCubePair( DIST3, p, s_q );
        }
        else if ( s_Distance == 2 )
        { 
            if ( s_fDistEnable2 ) 
                NewRangeInsertCubePair( DIST2, p, s_q );
        }
        else if ( s_Distance == 1 )
        {   // extract the cube from the data structure

            //////////////////////////////////////////////////////////
            // store the changes
            s_ChangeStore.fInput = (s_DiffVarNum != -1);
            s_ChangeStore.p      = p;
            s_ChangeStore.PrevQa = s_q->a;
            s_ChangeStore.PrevPa = p->a;
            s_ChangeStore.PrevQq = s_q->q;
            s_ChangeStore.PrevPq = p->q;
            s_ChangeStore.PrevPz = p->z;
            s_ChangeStore.Var    = s_DiffVarNum;
            s_ChangeStore.Value  = s_DiffVarValueQ;
            s_ChangeStore.PrevID = s_q->ID;
            //////////////////////////////////////////////////////////

            CubeExtract( s_q );
            // perform the EXOR of the two cubes and write the result into p

            // it is important that the resultant cube is written into p!!!

            if ( s_DiffVarNum == -1 )
            {
                int i;
                // exor the output part
                p->z = 0;
                for ( i = 0; i < g_CoverInfo.nWordsOut; i++ )
                {
                    p->pCubeDataOut[i] ^= s_q->pCubeDataOut[i];
                    p->z += BIT_COUNT(p->pCubeDataOut[i]);
                }
            }
            else
            {
                // the cube has already been updated by GetDistancePlus()

                // modify the parameters of the number of literals in the new cube
//              p->a += s_UpdateLiterals[ s_DiffVarValueP ][ s_DiffVarValueQ ];
                if ( s_DiffVarValueP_old == VAR_NEG || s_DiffVarValueP_old == VAR_POS )
                    p->a--;
                if ( s_DiffVarValueP_new == VAR_NEG || s_DiffVarValueP_new == VAR_POS )
                    p->a++;
                p->q = ComputeQCostBits(p);
            }

            // move q to the free cube list
            AddToFreeCubes( s_q );

            // make sure that nobody with use the pairs created so far
//          NewRangeReset();
            // call the function again for the new cube
            return 1 + CheckForCloseCubes( p, 1 );
        }
        else // if ( Distance == 0 )
        {   // extract the second cube from the data structure and add them both to the free list
            AddToFreeCubes( p );
            AddToFreeCubes( CubeExtract( s_q ) );

            // make sure that nobody with use the pairs created so far
            NewRangeReset();
            return 2;
        }
    }
    
    // add the cube to the data structure if needed
    if ( fAddCube )
        CubeInsert( p );

    // add temporarily stored new range of cube pairs to the queque
    NewRangeAdd();

    return 0;
}